

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * bitor(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Token *start;
  C_Token *pCVar5;
  C_Token *pCVar6;
  C_Token *local_40;
  C_Token **local_38;
  
  local_40 = tok;
  local_38 = rest;
  pCVar2 = bitxor(parser,&local_40,tok);
  pCVar5 = local_40;
  _Var1 = C_equal(local_40,"|");
  pCVar4 = pCVar2;
  pCVar6 = pCVar5;
  if (_Var1) {
    do {
      pCVar3 = bitxor(parser,&local_40,pCVar5->next);
      pCVar4 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar6 = local_40;
      pCVar4->kind = ND_BITOR;
      pCVar4->tok = pCVar5;
      pCVar4->lhs = pCVar2;
      pCVar4->rhs = pCVar3;
      _Var1 = C_equal(local_40,"|");
      pCVar2 = pCVar4;
      pCVar5 = pCVar6;
    } while (_Var1);
  }
  *local_38 = pCVar6;
  return pCVar4;
}

Assistant:

static C_Node *bitor(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = bitxor(parser, &tok, tok);
  while (C_equal(tok, "|")) {
    C_Token *start = tok;
    node = new_binary(parser, ND_BITOR, node, bitxor(parser, &tok, tok->next), start);
  }
  *rest = tok;
  return node;
}